

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O1

int __thiscall gl4cts::KHRDebug::TestBase::init(TestBase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (this->m_is_debug == true) {
    initDebug(this);
  }
  else {
    initNonDebug(this);
  }
  pRVar1 = this->m_rc;
  this->m_orig_rc = this->m_test_base_context->m_renderCtx;
  this->m_test_base_context->m_renderCtx = pRVar1;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])();
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar2);
  return iVar2;
}

Assistant:

void TestBase::init()
{
	if (true == m_is_debug)
	{
		initDebug();
	}
	else
	{
		initNonDebug();
	}

	m_orig_rc = &m_test_base_context.getRenderContext();
	m_test_base_context.setRenderContext(m_rc);

	/* Get functions */
	m_gl = &m_rc->getFunctions();
}